

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

void __thiscall
amrex::DistributionMapping::RoundRobinProcessorMap
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int nprocs,bool sort)

{
  element_type *peVar1;
  pointer piVar2;
  int extraout_EDX;
  ulong uVar3;
  uint uVar4;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> local_58;
  pair<long,_int> local_40;
  
  peVar1 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar2 = *(pointer *)
            &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (*(pointer *)
       ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar2) {
    *(pointer *)
     ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar2;
  }
  piVar2 = (peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar2) {
    *(pointer *)
     ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar2;
  }
  (((_Bit_iterator *)
   ((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p =
       *(_Bit_type **)
        &(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start;
  *(uint *)((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data + 0x18) = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             (this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pair<long,_int> *)0x0;
  local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pair<long,_int> *)0x0;
  uVar4 = (uint)((ulong)((long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve
            (&local_58,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      local_40.first =
           (wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start[uVar3];
      local_40.second = (int)uVar3;
      if (local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
        _M_realloc_insert<std::pair<long,int>>
                  ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first = local_40.first;
        *(ulong *)&(local_58.
                    super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->second =
             CONCAT44(local_40._12_4_,local_40.second);
        local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  Sort(&local_58,true);
  RoundRobinDoIt(this,(int)((ulong)((long)(wgts->super__Vector_base<long,_std::allocator<long>_>).
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(wgts->super__Vector_base<long,_std::allocator<long>_>).
                                         _M_impl.super__Vector_impl_data._M_start) >> 3),
                 extraout_EDX,&local_58,sort);
  if (local_58.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
DistributionMapping::RoundRobinProcessorMap (const std::vector<Long>& wgts,
                                             int nprocs, bool sort)
{
    BL_ASSERT(wgts.size() > 0);

    m_ref->clear();
    m_ref->m_pmap.resize(wgts.size());

    //
    // Create ordering of boxes from "heaviest" to "lightest".
    // When we round-robin the boxes we want to go from heaviest
    // to lightest box, starting from the CPU having the least
    // amount of FAB data to the one having the most.  This "should"
    // help even out the FAB data distribution when running on large
    // numbers of CPUs, where the lower levels of the calculation are
    // using RoundRobin to lay out fewer than NProc boxes across
    // the CPUs.
    //
    std::vector<LIpair> LIpairV;

    const int N = wgts.size();

    LIpairV.reserve(N);

    for (int i = 0; i < N; ++i)
    {
        LIpairV.push_back(LIpair(wgts[i],i));
    }

    Sort(LIpairV, true);

    RoundRobinDoIt(wgts.size(), nprocs, &LIpairV, sort);
}